

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O2

double __thiscall ON_Xform::GetMappingXforms(ON_Xform *this,ON_Xform *P_xform,ON_Xform *N_xform)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  double dVar6;
  double p;
  double local_20;
  
  bVar5 = 0;
  local_20 = 0.0;
  p = 0.0;
  iVar1 = Inv((double *)this,(double (*) [4])P_xform,&local_20,&p);
  if ((((iVar1 == 4) && (dVar6 = ABS(local_20), 3.308722450213671e-24 < dVar6)) &&
      (dVar6 * 3.308722450213671e-24 < 1.0)) && (dVar6 * 2.220446049250313e-16 < ABS(p))) {
    N_xform->m_xform[0][0] = this->m_xform[0][0];
    N_xform->m_xform[0][1] = this->m_xform[1][0];
    N_xform->m_xform[0][2] = this->m_xform[2][0];
    N_xform->m_xform[0][3] = 0.0;
    N_xform->m_xform[1][0] = this->m_xform[0][1];
    N_xform->m_xform[1][1] = this->m_xform[1][1];
    N_xform->m_xform[1][2] = this->m_xform[2][1];
    N_xform->m_xform[1][3] = 0.0;
    N_xform->m_xform[2][0] = this->m_xform[0][2];
    N_xform->m_xform[2][1] = this->m_xform[1][2];
    N_xform->m_xform[2][2] = this->m_xform[2][2];
    N_xform->m_xform[2][3] = 0.0;
    N_xform->m_xform[3][0] = 0.0;
    N_xform->m_xform[3][1] = 0.0;
    N_xform->m_xform[3][2] = 0.0;
    N_xform->m_xform[3][3] = 1.0;
    return local_20;
  }
  lVar3 = 0x10;
  pOVar4 = &IdentityTransformation;
  for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
    P_xform->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    P_xform = (ON_Xform *)((long)P_xform + ((ulong)bVar5 * -2 + 1) * 8);
  }
  pOVar4 = &IdentityTransformation;
  for (; lVar3 != 0; lVar3 = lVar3 + -1) {
    N_xform->m_xform[0][0] = pOVar4->m_xform[0][0];
    pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar5 * -2 + 1) * 8);
    N_xform = (ON_Xform *)((long)N_xform + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return 0.0;
}

Assistant:

double ON_Xform::GetMappingXforms( ON_Xform& P_xform, ON_Xform& N_xform ) const
{
  double d = 0.0, p = 0.0;
  double dtol = ON_SQRT_EPSILON*ON_SQRT_EPSILON*ON_SQRT_EPSILON;
  if ( 4 == Inv( &m_xform[0][0], P_xform.m_xform, &d, &p ) 
       && fabs(d) > dtol 
       && fabs(d)*dtol < 1.0
       && fabs(p) > ON_EPSILON*fabs(d)
     )
  {
    // Set N_xform = transpose of this (only upper 3x3 matters)
    N_xform.m_xform[0][0] = m_xform[0][0];
    N_xform.m_xform[0][1] = m_xform[1][0]; 
    N_xform.m_xform[0][2] = m_xform[2][0];
    N_xform.m_xform[0][3] = 0.0;

    N_xform.m_xform[1][0] = m_xform[0][1];
    N_xform.m_xform[1][1] = m_xform[1][1];
    N_xform.m_xform[1][2] = m_xform[2][1];
    N_xform.m_xform[1][3] = 0.0;

    N_xform.m_xform[2][0] = m_xform[0][2];
    N_xform.m_xform[2][1] = m_xform[1][2];
    N_xform.m_xform[2][2] = m_xform[2][2];
    N_xform.m_xform[2][3] = 0.0;

    N_xform.m_xform[3][0] = 0.0;
    N_xform.m_xform[3][1] = 0.0;
    N_xform.m_xform[3][2] = 0.0;
    N_xform.m_xform[3][3] = 1.0;
  }
  else
  {
    P_xform = ON_Xform::IdentityTransformation;
    N_xform = ON_Xform::IdentityTransformation;
    d = 0.0;
  }
  return d;
}